

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> *
adios2::format::BP5Helper::BuildNodeContrib
          (digest attrHash,size_t attrSize,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *MMBlocks,size_t MetaEncodeSize,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  bool bVar1;
  const_iterator buffer;
  const_iterator position_00;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_RDI;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  size_t AlignedSize;
  digest D;
  MetaMetaInfoBlock *MM;
  const_iterator __end2;
  const_iterator __begin2;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *__range2;
  size_t position;
  size_t len;
  size_t MMBlocksSize;
  vector<char,_std::allocator<char>_> *ret;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_type in_stack_ffffffffffffff68;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  reference in_stack_ffffffffffffff80;
  size_t *in_stack_ffffffffffffff88;
  __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
  in_stack_ffffffffffffff90;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xd1d082);
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::size(in_R8);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  helper::CopyToBuffer<char>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff90._M_current,
             in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff90._M_current,
             in_stack_ffffffffffffff88,(unsigned_long *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff90._M_current,
             in_stack_ffffffffffffff88,(unsigned_long *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  buffer = std::
           vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           ::begin(in_RDI);
  position_00 = std::
                vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                ::end(in_RDI);
  this = in_stack_00000008;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                             *)this,(__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                                     *)in_RDI), bVar1) {
    in_stack_ffffffffffffff80 =
         __gnu_cxx::
         __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
         ::operator*((__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                      *)&stack0xffffffffffffff90);
    digest::digest((digest *)&stack0xffffffffffffff70);
    memcpy(&stack0xffffffffffffff70,in_stack_ffffffffffffff80->MetaMetaID,
           in_stack_ffffffffffffff80->MetaMetaIDLen);
    helper::CopyToBuffer<char>
              ((vector<char,_std::allocator<char>_> *)buffer._M_current,
               (size_t *)position_00._M_current,(char *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    helper::CopyToBuffer<unsigned_long>
              ((vector<char,_std::allocator<char>_> *)buffer._M_current,
               (size_t *)position_00._M_current,(unsigned_long *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
    ::operator++((__normal_iterator<const_adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                  *)&stack0xffffffffffffff90);
  }
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)buffer._M_current,
             (size_t *)position_00._M_current,(unsigned_long *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,0);
  helper::CopyToBuffer<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)buffer._M_current,
             (size_t *)position_00._M_current,(unsigned_long *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  return (vector<char,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::vector<char>
BP5Helper::BuildNodeContrib(const digest attrHash, const size_t attrSize,
                            const std::vector<BP5Base::MetaMetaInfoBlock> MMBlocks,
                            const size_t MetaEncodeSize,
                            const std::vector<uint64_t> WriterDataPositions)
{
    std::vector<char> ret;
    size_t MMBlocksSize = MMBlocks.size();
    size_t len = sizeof(digest) + 2 * sizeof(size_t) +
                 MMBlocksSize * (sizeof(size_t) + sizeof(digest)) + sizeof(size_t) +
                 sizeof(uint64_t);
    ret.resize(len);
    size_t position = 0;
    helper::CopyToBuffer(ret, position, (char *)&attrHash.x[0], sizeof(digest));
    helper::CopyToBuffer(ret, position, &attrSize, 1);
    helper::CopyToBuffer(ret, position, &MMBlocksSize, 1);
    for (auto &MM : MMBlocks)
    {
        digest D;
        std::memcpy(&D.x[0], MM.MetaMetaID, MM.MetaMetaIDLen);
        helper::CopyToBuffer(ret, position, (char *)&D.x[0], sizeof(digest));
        size_t AlignedSize = ((MM.MetaMetaInfoLen + 7) & ~0x7);
        helper::CopyToBuffer(ret, position, &AlignedSize, 1);
    }
    helper::CopyToBuffer(ret, position, &MetaEncodeSize, 1);
    helper::CopyToBuffer(ret, position, &WriterDataPositions[0], 1);
    return ret;
}